

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::EmissionContext::EmissionContext
          (EmissionContext *this,shared_ptr<compiler::EmissionContext> *outerContext)

{
  shared_ptr<compiler::EmissionContext> *outerContext_local;
  EmissionContext *this_local;
  
  std::vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>::vector
            (&this->variables);
  std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::vector
            (&this->closures);
  this->firstFreeVariablesIndex = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->scopeStartIndex);
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::vector(&this->byteCode);
  std::shared_ptr<compiler::EmissionContext>::shared_ptr(&this->outerContext,outerContext);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->loopStartIndices);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->loopConditionEvalJumpIndices);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::unordered_map(&this->breakStatementsForLoops);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->ifConditionEvalJumpIndices);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->elseStatementStartIndex)
  ;
  return;
}

Assistant:

explicit EmissionContext(
    std::shared_ptr<EmissionContext> outerContext
  ) noexcept
  : outerContext{std::move(outerContext)}
  {}